

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_encode.c
# Opt level: O2

void yajl_string_decode(yajl_buf buf,uchar *str,size_t len)

{
  uchar *data;
  uchar uVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  size_t len_00;
  char utf8Buf [5];
  uint codepoint;
  uint surrogate;
  uchar *local_40;
  yajl_buf local_38;
  
  lVar5 = 0;
LAB_001042f8:
  data = str + lVar5;
  len_00 = 0;
  while( true ) {
    if (len <= lVar5 + len_00) {
      yajl_buf_append(buf,data,len_00);
      return;
    }
    if (data[len_00] == '\\') break;
    len_00 = len_00 + 1;
  }
  local_40 = str;
  yajl_buf_append(buf,data,len_00);
  lVar4 = lVar5 + len_00 + 1;
  uVar1 = data[len_00 + 1];
  local_38 = buf;
  switch(uVar1) {
  case 'n':
    pcVar6 = "\n";
    break;
  case 'o':
  case 'p':
  case 'q':
  case 's':
switchD_0010438d_caseD_6f:
    pcVar6 = "?";
    break;
  case 'r':
    pcVar6 = "\r";
    break;
  case 't':
    pcVar6 = "\t";
    break;
  case 'u':
    codepoint = 0;
    hexToDigit(&codepoint,data + len_00 + 2);
    buf = local_38;
    uVar2 = codepoint;
    if ((codepoint & 0xfc00) == 0xd800) {
      lVar4 = lVar5 + len_00 + 6;
      if (data[len_00 + 6] != '\\') goto switchD_0010438d_caseD_6f;
      pcVar6 = "?";
      if (data[len_00 + 7] == 'u') {
        surrogate = 0;
        hexToDigit(&surrogate,data + len_00 + 8);
        codepoint = (uVar2 & 0x3ff) * 0x400 + (surrogate & 0x3ff) + 0x10000;
        lVar4 = lVar5 + len_00 + 0xb;
LAB_00104452:
        utf8Buf[1] = (byte)(codepoint >> 0xc) & 0x3f | 0x80;
        utf8Buf[2] = (byte)(codepoint >> 6) & 0x3f | 0x80;
        utf8Buf[3] = (byte)codepoint & 0x3f | 0x80;
        pcVar6 = utf8Buf + 4;
        utf8Buf[0] = (byte)(codepoint >> 0x12) | 0xf0;
        goto LAB_0010457e;
      }
      break;
    }
    lVar4 = lVar5 + len_00 + 5;
    utf8Buf[0] = (char)codepoint;
    if (0x7f < codepoint) {
      if (codepoint < 0x800) {
        utf8Buf[1] = utf8Buf[0] & 0x3fU | 0x80;
        pcVar6 = utf8Buf + 2;
        utf8Buf[0] = (byte)(codepoint >> 6) | 0xc0;
      }
      else if (codepoint < 0x10000) {
        utf8Buf[1] = (byte)(codepoint >> 6) & 0x3f | 0x80;
        utf8Buf[2] = utf8Buf[0] & 0x3fU | 0x80;
        pcVar6 = utf8Buf + 3;
        utf8Buf[0] = (byte)(codepoint >> 0xc) | 0xe0;
      }
      else {
        if (codepoint < 0x200000) goto LAB_00104452;
        utf8Buf[0] = '?';
        pcVar6 = utf8Buf + 1;
      }
LAB_0010457e:
      *pcVar6 = '\0';
      pcVar6 = utf8Buf;
      break;
    }
    utf8Buf[1] = '\0';
    pcVar6 = utf8Buf;
    if (codepoint != 0) break;
    lVar5 = lVar5 + len_00 + 6;
    yajl_buf_append(local_38,utf8Buf,1);
    str = local_40;
    goto LAB_001042f8;
  default:
    if (uVar1 == '\"') {
      pcVar6 = "\"";
    }
    else if (uVar1 == '/') {
      pcVar6 = "/";
    }
    else if (uVar1 == '\\') {
      pcVar6 = "\\";
    }
    else if (uVar1 == 'b') {
      pcVar6 = "\b";
    }
    else {
      if (uVar1 != 'f') goto switchD_0010438d_caseD_6f;
      pcVar6 = "\f";
    }
  }
  sVar3 = strlen(pcVar6);
  buf = local_38;
  yajl_buf_append(local_38,pcVar6,sVar3 & 0xffffffff);
  lVar5 = lVar4 + 1;
  str = local_40;
  goto LAB_001042f8;
}

Assistant:

void yajl_string_decode(yajl_buf buf, const unsigned char * str,
                        size_t len)
{
    size_t beg = 0;
    size_t end = 0;    

    while (end < len) {
        if (str[end] == '\\') {
            char utf8Buf[5];
            const char * unescaped = "?";
            yajl_buf_append(buf, str + beg, end - beg);
            switch (str[++end]) {
                case 'r': unescaped = "\r"; break;
                case 'n': unescaped = "\n"; break;
                case '\\': unescaped = "\\"; break;
                case '/': unescaped = "/"; break;
                case '"': unescaped = "\""; break;
                case 'f': unescaped = "\f"; break;
                case 'b': unescaped = "\b"; break;
                case 't': unescaped = "\t"; break;
                case 'u': {
                    unsigned int codepoint = 0;
                    hexToDigit(&codepoint, str + ++end);
                    end+=3;
                    /* check if this is a surrogate */
                    if ((codepoint & 0xFC00) == 0xD800) {
                        end++;
                        if (str[end] == '\\' && str[end + 1] == 'u') {
                            unsigned int surrogate = 0;
                            hexToDigit(&surrogate, str + end + 2);
                            codepoint =
                                (((codepoint & 0x3F) << 10) | 
                                 ((((codepoint >> 6) & 0xF) + 1) << 16) | 
                                 (surrogate & 0x3FF));
                            end += 5;
                        } else {
                            unescaped = "?";
                            break;
                        }
                    }
                    
                    Utf32toUtf8(codepoint, utf8Buf);
                    unescaped = utf8Buf;

                    if (codepoint == 0) {
                        yajl_buf_append(buf, unescaped, 1);
                        beg = ++end;
                        continue;
                    }

                    break;
                }
                default:
                    assert("this should never happen" == NULL);
            }
            yajl_buf_append(buf, unescaped, (unsigned int)strlen(unescaped));
            beg = ++end;
        } else {
            end++;
        }
    }
    yajl_buf_append(buf, str + beg, end - beg);
}